

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle2.cpp
# Opt level: O0

void __thiscall
OpenMD::ContactAngle2::ContactAngle2
          (ContactAngle2 *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType solidZ,RealType centroidX,RealType centroidY,RealType threshDens,
          RealType bufferLength,int nrbins,int nzbins)

{
  ostream *poVar1;
  SequentialAnalyzer *this_00;
  string *params_00;
  undefined8 *in_RDI;
  int in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  int in_stack_00000008;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffd38;
  SequentialAnalyzer *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  string local_250 [32];
  stringstream local_230 [16];
  ostream local_220 [32];
  string *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  SimInfo *in_stack_fffffffffffffe18;
  SequentialAnalyzer *in_stack_fffffffffffffe20;
  string local_98 [32];
  string local_78 [36];
  int local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_54 = in_R9D;
  local_50 = in_XMM4_Qa;
  local_48 = in_XMM3_Qa;
  local_40 = in_XMM2_Qa;
  local_38 = in_XMM1_Qa;
  local_30 = in_XMM0_Qa;
  SequentialAnalyzer::SequentialAnalyzer
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  *in_RDI = &PTR__ContactAngle2_00394b18;
  in_RDI[0x1a9] = local_30;
  in_RDI[0x1aa] = local_38;
  in_RDI[0x1ab] = local_40;
  in_RDI[0x1ac] = local_48;
  in_RDI[0x1ad] = local_50;
  in_RDI[0x1ae] = (long)local_54;
  in_RDI[0x1af] = (long)in_stack_00000008;
  getPrefix(in_stack_fffffffffffffd48);
  std::operator+(in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
  SequentialAnalyzer::setOutputName(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::stringstream::stringstream(local_230);
  poVar1 = std::operator<<(local_220," referenceZ = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_RDI[0x1a9]);
  poVar1 = std::operator<<(poVar1,", centroid = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_RDI[0x1aa]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_RDI[0x1ab]);
  poVar1 = std::operator<<(poVar1,")");
  poVar1 = std::operator<<(poVar1,", threshDens = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_RDI[0x1ac]);
  poVar1 = std::operator<<(poVar1,", bufferLength = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_RDI[0x1ad]);
  poVar1 = std::operator<<(poVar1,", nbins = ");
  this_00 = (SequentialAnalyzer *)std::ostream::operator<<(poVar1,in_RDI[0x1ae]);
  params_00 = (string *)std::operator<<((ostream *)this_00,", nbins_z = ");
  std::ostream::operator<<(params_00,in_RDI[0x1af]);
  std::__cxx11::stringstream::str();
  SequentialAnalyzer::setParameterString(this_00,params_00);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::stringstream::~stringstream(local_230);
  return;
}

Assistant:

ContactAngle2::ContactAngle2(SimInfo* info, const std::string& filename,
                               const std::string& sele1,
                               const std::string& sele2, RealType solidZ,
                               RealType centroidX, RealType centroidY,
                               RealType threshDens, RealType bufferLength,
                               int nrbins, int nzbins) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      solidZ_(solidZ), centroidX_(centroidX), centroidY_(centroidY),
      threshDens_(threshDens), bufferLength_(bufferLength), nRBins_(nrbins),
      nZBins_(nzbins) {
    setOutputName(getPrefix(filename) + ".ca2");

    std::stringstream params;
    params << " referenceZ = " << solidZ_ << ", centroid = (" << centroidX_
           << ", " << centroidY_ << ")"
           << ", threshDens = " << threshDens_
           << ", bufferLength = " << bufferLength_ << ", nbins = " << nRBins_
           << ", nbins_z = " << nZBins_;

    const std::string paramString = params.str();
    setParameterString(paramString);
  }